

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Trigger * sqlite3TriggersExist(Parse *pParse,Table *pTab,int op,ExprList *pChanges,int *pMask)

{
  int iVar1;
  Trigger *pTVar2;
  long in_RSI;
  int *in_RDI;
  undefined4 *in_R8;
  int unaff_retaddr;
  ExprList *in_stack_fffffffffffffff8;
  
  if (((*(long *)(in_RSI + 0x58) != 0) ||
      (iVar1 = tempTriggersExist(*(sqlite3 **)in_RDI), iVar1 != 0)) &&
     (*(char *)((long)in_RDI + 0xe5) == '\0')) {
    pTVar2 = triggersReallyExist((Parse *)pChanges,(Table *)pMask,unaff_retaddr,
                                 in_stack_fffffffffffffff8,in_RDI);
    return pTVar2;
  }
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 0;
  }
  return (Trigger *)0x0;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggersExist(
  Parse *pParse,          /* Parse context */
  Table *pTab,            /* The table the contains the triggers */
  int op,                 /* one of TK_DELETE, TK_INSERT, TK_UPDATE */
  ExprList *pChanges,     /* Columns that change in an UPDATE statement */
  int *pMask              /* OUT: Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
){
  assert( pTab!=0 );
  if( (pTab->pTrigger==0 && !tempTriggersExist(pParse->db))
   || pParse->disableTriggers
  ){
    if( pMask ) *pMask = 0;
    return 0;
  }
  return triggersReallyExist(pParse,pTab,op,pChanges,pMask);
}